

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoAtomicLoad<unsigned_long,unsigned_long>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  Store *store;
  Result RVar1;
  u64 offset;
  RunResult RVar2;
  unsigned_long val;
  Ptr memory;
  Ptr local_68;
  string local_50;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&memory,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  offset = PopPtr(this,&memory);
  RVar1 = Memory::AtomicLoad<unsigned_long>
                    (memory.obj_,offset,(ulong)instr.field_2.imm_u32x2.snd,&val);
  if (RVar1.enum_ == Error) {
    store = this->store_;
    StringPrintf_abi_cxx11_
              (&local_50,"invalid atomic access at %lu+%u",offset,(ulong)instr.field_2.imm_u32x2.snd
              );
    Trap::New(&local_68,store,&local_50,&this->frames_);
    out_trap->obj_ = local_68.obj_;
    out_trap->store_ = local_68.store_;
    out_trap->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar2 = Trap;
  }
  else {
    Push<unsigned_long>(this,val);
    RVar2 = Ok;
  }
  RefPtr<wabt::interp::Memory>::reset(&memory);
  return RVar2;
}

Assistant:

RunResult Thread::DoAtomicLoad(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  u64 offset = PopPtr(memory);
  V val;
  TRAP_IF(Failed(memory->AtomicLoad(offset, instr.imm_u32x2.snd, &val)),
          StringPrintf("invalid atomic access at %" PRIaddress "+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<T>(val));
  return RunResult::Ok;
}